

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O3

void print_payload(uint8_t *data,uint_fast8_t length)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,length) != 0) {
    fwrite(data,(ulong)length,1,_stdout);
    fflush(_stdout);
    fputc(10,_stdout);
    return;
  }
  fwrite("no payload\n",0xb,1,_stdout);
  return;
}

Assistant:

static void print_payload(const uint8_t *data, uint_fast8_t length)
{
	if (length > 0) {
		(void)fwrite(data, length, 1, stdout);
		(void)fflush(stdout);
		(void)fprintf(stdout, "\n");
	} else {
		(void)fprintf(stdout, "no payload\n");
	}
}